

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

Error __thiscall llvm::DWARFUnit::tryExtractDIEsIfNeeded(DWARFUnit *this,bool CUDieOnly)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  bool bVar3;
  undefined7 uVar4;
  byte bVar5;
  int iVar6;
  unsigned_long *puVar7;
  uint64_t uVar8;
  Twine *pTVar9;
  storage_type *psVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  storage_type *y;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *this_00;
  int in_EDX;
  Error *E;
  Error *E_00;
  undefined7 in_register_00000031;
  DWARFUnit *this_01;
  pointer pDVar12;
  pointer pDVar13;
  Optional<unsigned_long> OVar14;
  error_code EC;
  error_code EC_00;
  Twine local_190;
  undefined1 local_178 [8];
  Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> StringOffsetOrError;
  byte local_e0;
  undefined1 local_d8 [8];
  DWARFDataExtractor RangesDA;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aStack_90;
  DWARFDataExtractor DA;
  undefined1 local_48 [8];
  DWARFDie UnitDie;
  undefined8 local_30;
  DWARFObject *pDVar11;
  
  this_01 = (DWARFUnit *)CONCAT71(in_register_00000031,CUDieOnly);
  if (in_EDX == 0) {
    pDVar12 = (this_01->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pDVar13 = (this_01->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pDVar12 = (this_01->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar13 = pDVar12;
    if (pDVar12 !=
        (this_01->DieArray).
        super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) goto LAB_00d9f68f;
  }
  if ((ulong)(((long)pDVar12 - (long)pDVar13) / 0x18) < 2) {
    extractDIEsToVector(this_01,pDVar13 == pDVar12,(bool)((byte)in_EDX ^ 1),&this_01->DieArray);
    UnitDie.U = (DWARFUnit *)
                (this_01->DieArray).
                super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if ((UnitDie.U !=
         (DWARFUnit *)
         (this_01->DieArray).
         super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish) && (pDVar13 == pDVar12)) {
      local_48 = (undefined1  [8])this_01;
      DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_178,(DWARFDie *)local_48,
                     DW_AT_GNU_dwo_id);
      OVar14 = dwarf::toUnsigned((Optional<llvm::DWARFFormValue> *)local_178);
      aStack_90 = OVar14.Storage.field_0;
      DA.super_DataExtractor.Data.Data =
           (char *)CONCAT71(DA.super_DataExtractor.Data.Data._1_7_,OVar14.Storage.hasVal);
      if (((undefined1  [16])OVar14.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar7 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                           ((OptionalStorage<unsigned_long,_true> *)&aStack_90);
        DWARFUnitHeader::setDWOId(&this_01->Header,*puVar7);
      }
      bVar5 = this_01->IsDWO;
      if ((bool)bVar5 == false) {
        if (this_01->AddrOffsetSectionBase != 0) {
          __assert_fail("AddrOffsetSectionBase == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                        ,0x1ae,"Error llvm::DWARFUnit::tryExtractDIEsIfNeeded(bool)");
        }
        if (this_01->RangeSectionBase != 0) {
          __assert_fail("RangeSectionBase == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFUnit.cpp"
                        ,0x1af,"Error llvm::DWARFUnit::tryExtractDIEsIfNeeded(bool)");
        }
        DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_178,(DWARFDie *)local_48,
                       DW_AT_addr_base);
        uVar8 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)local_178,0);
        this_01->AddrOffsetSectionBase = (uint32_t)uVar8;
        if ((uint32_t)uVar8 == 0) {
          DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_178,(DWARFDie *)local_48,
                         DW_AT_GNU_addr_base);
          uVar8 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)local_178,0);
          this_01->AddrOffsetSectionBase = (uint32_t)uVar8;
        }
        DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_178,(DWARFDie *)local_48,
                       DW_AT_rnglists_base);
        uVar8 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)local_178,0);
        this_01->RangeSectionBase = uVar8;
        bVar5 = this_01->IsDWO;
      }
      DA.Obj = (DWARFObject *)this_01->StringOffsetSection;
      DA.super_DataExtractor._16_8_ =
           (this_01->Context->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
      DA.super_DataExtractor.Data.Length._0_1_ = this_01->isLittleEndian;
      aStack_90 = *(anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 *)DA.Obj;
      DA.super_DataExtractor.Data.Data = *(char **)((long)DA.Obj + 8);
      DA.super_DataExtractor.Data.Length._1_1_ = 0;
      if ((bVar5 & 1) == 0) {
        if ((this_01->Header).FormParams.Version < 5) goto LAB_00d9f68f;
        determineStringOffsetsTableContribution
                  ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)local_178,
                   this_01,(DWARFDataExtractor *)&aStack_90);
      }
      else {
        determineStringOffsetsTableContributionDWO
                  ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)local_178,
                   this_01,(DWARFDataExtractor *)&aStack_90);
      }
      if ((StringOffsetOrError.field_0.TStorage.buffer[0x18] & 1U) == 0) {
        psVar10 = Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>::getStorage
                            ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)
                             local_178);
        uVar8 = (psVar10->Storage).field_0.value.Size;
        uVar2 = *(undefined8 *)((long)&(psVar10->Storage).field_0 + 0x10);
        bVar3 = (psVar10->Storage).hasVal;
        uVar4 = *(undefined7 *)&(psVar10->Storage).field_0x19;
        (this_01->StringOffsetsTableContribution).Storage.field_0.value.Base =
             (psVar10->Storage).field_0.value.Base;
        (this_01->StringOffsetsTableContribution).Storage.field_0.value.Size = uVar8;
        *(undefined8 *)((long)&(this_01->StringOffsetsTableContribution).Storage.field_0 + 0x10) =
             uVar2;
        (this_01->StringOffsetsTableContribution).Storage.hasVal = bVar3;
        *(undefined7 *)&(this_01->StringOffsetsTableContribution).Storage.field_0x19 = uVar4;
      }
      else {
        pTVar9 = (Twine *)std::_V2::generic_category();
        Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>::takeError
                  ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)&UnitDie.Die
                  );
        toString_abi_cxx11_((string *)&DA.Section,(llvm *)&UnitDie.Die,E);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8
                       ,"invalid reference to or invalid content in .debug_str_offsets[.dwo]: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &DA.Section);
        Twine::Twine((Twine *)&RangesDA.Section,(string *)local_d8);
        EC._M_cat = (error_category *)0x16;
        EC._0_8_ = this;
        createStringError(EC,pTVar9);
        std::__cxx11::string::~string((string *)local_d8);
        std::__cxx11::string::~string((string *)&DA.Section);
        if ((long *)((ulong)UnitDie.Die & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)UnitDie.Die & 0xfffffffffffffffe) + 8))();
        }
      }
      Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>::~Expected
                ((Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *)local_178);
      if ((StringOffsetOrError.field_0.TStorage.buffer[0x18] & 1U) != 0) {
        return (Error)this;
      }
      if (4 < (this_01->Header).FormParams.Version) {
        pp_Var1 = ((this_01->Context->DObj)._M_t.
                   super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                   .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                  _vptr_DWARFObject;
        if (this_01->IsDWO == true) {
          iVar6 = (*pp_Var1[0x22])();
          pDVar11 = (DWARFObject *)CONCAT44(extraout_var,iVar6);
          uVar8 = 0;
        }
        else {
          iVar6 = (*pp_Var1[0x13])();
          pDVar11 = (DWARFObject *)CONCAT44(extraout_var_00,iVar6);
          DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_178,(DWARFDie *)local_48,
                         DW_AT_rnglists_base);
          uVar8 = dwarf::toSectionOffset((Optional<llvm::DWARFFormValue> *)local_178,0);
        }
        this_01->RangeSection = (DWARFSection *)pDVar11;
        this_01->RangeSectionBase = uVar8;
        RangesDA.super_DataExtractor.Data.Data = (pDVar11->Dummy).Data.Data;
        if (RangesDA.super_DataExtractor.Data.Data != (char *)0x0) {
          RangesDA.super_DataExtractor._16_8_ =
               (this_01->Context->DObj)._M_t.
               super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
               .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
          RangesDA.super_DataExtractor.Data.Length._0_1_ = this_01->isLittleEndian;
          local_d8 = (undefined1  [8])((StringRef *)&pDVar11->_vptr_DWARFObject)->Data;
          RangesDA.super_DataExtractor.Data.Length._1_1_ = 0;
          RangesDA.Obj = pDVar11;
          parseRngListTableHeader
                    ((Expected<llvm::DWARFDebugRnglistTable> *)local_178,
                     (DWARFDataExtractor *)local_d8,uVar8,(this_01->Header).FormParams.Format);
          if ((local_e0 & 1) == 0) {
            y = Expected<llvm::DWARFDebugRnglistTable>::getStorage
                          ((Expected<llvm::DWARFDebugRnglistTable> *)local_178);
            optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::operator=
                      (&(this_01->RngListTable).Storage,y);
            if ((this_01->IsDWO == true) && ((this_01->RngListTable).Storage.hasVal == true)) {
              this_00 = &optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::
                         getValue(&(this_01->RngListTable).Storage)->
                         super_DWARFListTableBase<llvm::DWARFDebugRnglist>;
              bVar5 = DWARFListTableBase<llvm::DWARFDebugRnglist>::getHeaderSize(this_00);
              this_01->RangeSectionBase = (ulong)bVar5;
            }
          }
          else {
            pTVar9 = (Twine *)std::_V2::generic_category();
            Expected<llvm::DWARFDebugRnglistTable>::takeError
                      ((Expected<llvm::DWARFDebugRnglistTable> *)&stack0xffffffffffffffd0);
            toString_abi_cxx11_((string *)&RangesDA.Section,(llvm *)&stack0xffffffffffffffd0,E_00);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &DA.Section,"parsing a range list table: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &RangesDA.Section);
            Twine::Twine(&local_190,(string *)&DA.Section);
            EC_00._M_cat = (error_category *)0x16;
            EC_00._0_8_ = this;
            createStringError(EC_00,pTVar9);
            std::__cxx11::string::~string((string *)&DA.Section);
            std::__cxx11::string::~string((string *)&RangesDA.Section);
            if ((long *)(local_30 & 0xfffffffffffffffe) != (long *)0x0) {
              (**(code **)(*(long *)(local_30 & 0xfffffffffffffffe) + 8))();
            }
          }
          Expected<llvm::DWARFDebugRnglistTable>::~Expected
                    ((Expected<llvm::DWARFDebugRnglistTable> *)local_178);
          if ((local_e0 & 1) != 0) {
            return (Error)this;
          }
        }
      }
    }
  }
LAB_00d9f68f:
  this->_vptr_DWARFUnit = (_func_int **)0x1;
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFUnit::tryExtractDIEsIfNeeded(bool CUDieOnly) {
  if ((CUDieOnly && !DieArray.empty()) ||
      DieArray.size() > 1)
    return Error::success(); // Already parsed.

  bool HasCUDie = !DieArray.empty();
  extractDIEsToVector(!HasCUDie, !CUDieOnly, DieArray);

  if (DieArray.empty())
    return Error::success();

  // If CU DIE was just parsed, copy several attribute values from it.
  if (HasCUDie)
    return Error::success();

  DWARFDie UnitDie(this, &DieArray[0]);
  if (Optional<uint64_t> DWOId = toUnsigned(UnitDie.find(DW_AT_GNU_dwo_id)))
    Header.setDWOId(*DWOId);
  if (!IsDWO) {
    assert(AddrOffsetSectionBase == 0);
    assert(RangeSectionBase == 0);
    AddrOffsetSectionBase = toSectionOffset(UnitDie.find(DW_AT_addr_base), 0);
    if (!AddrOffsetSectionBase)
      AddrOffsetSectionBase =
          toSectionOffset(UnitDie.find(DW_AT_GNU_addr_base), 0);
    RangeSectionBase = toSectionOffset(UnitDie.find(DW_AT_rnglists_base), 0);
  }

  // In general, in DWARF v5 and beyond we derive the start of the unit's
  // contribution to the string offsets table from the unit DIE's
  // DW_AT_str_offsets_base attribute. Split DWARF units do not use this
  // attribute, so we assume that there is a contribution to the string
  // offsets table starting at offset 0 of the debug_str_offsets.dwo section.
  // In both cases we need to determine the format of the contribution,
  // which may differ from the unit's format.
  DWARFDataExtractor DA(Context.getDWARFObj(), StringOffsetSection,
                        isLittleEndian, 0);
  if (IsDWO || getVersion() >= 5) {
    auto StringOffsetOrError =
        IsDWO ? determineStringOffsetsTableContributionDWO(DA)
              : determineStringOffsetsTableContribution(DA);
    if (!StringOffsetOrError)
      return createStringError(errc::invalid_argument,
                               "invalid reference to or invalid content in "
                               ".debug_str_offsets[.dwo]: " +
                                   toString(StringOffsetOrError.takeError()));

    StringOffsetsTableContribution = *StringOffsetOrError;
  }

  // DWARF v5 uses the .debug_rnglists and .debug_rnglists.dwo sections to
  // describe address ranges.
  if (getVersion() >= 5) {
    if (IsDWO)
      setRangesSection(&Context.getDWARFObj().getRnglistsDWOSection(), 0);
    else
      setRangesSection(&Context.getDWARFObj().getRnglistsSection(),
                       toSectionOffset(UnitDie.find(DW_AT_rnglists_base), 0));
    if (RangeSection->Data.size()) {
      // Parse the range list table header. Individual range lists are
      // extracted lazily.
      DWARFDataExtractor RangesDA(Context.getDWARFObj(), *RangeSection,
                                  isLittleEndian, 0);
      auto TableOrError = parseRngListTableHeader(RangesDA, RangeSectionBase,
                                                  Header.getFormat());
      if (!TableOrError)
        return createStringError(errc::invalid_argument,
                                 "parsing a range list table: " +
                                     toString(TableOrError.takeError()));

      RngListTable = TableOrError.get();

      // In a split dwarf unit, there is no DW_AT_rnglists_base attribute.
      // Adjust RangeSectionBase to point past the table header.
      if (IsDWO && RngListTable)
        RangeSectionBase = RngListTable->getHeaderSize();
    }
  }

  // Don't fall back to DW_AT_GNU_ranges_base: it should be ignored for
  // skeleton CU DIE, so that DWARF users not aware of it are not broken.
  return Error::success();
}